

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_send_op<asio::detail::prepared_buffers<asio::const_buffer,_64UL>,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>_>
::reactive_socket_send_op
          (reactive_socket_send_op<asio::detail::prepared_buffers<asio::const_buffer,_64UL>,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>_>
           *this,socket_type socket,state_type state,
          prepared_buffers<asio::const_buffer,_64UL> *buffers,message_flags flags,
          write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
          *handler)

{
  func_type in_RDI;
  undefined4 in_R8D;
  write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  *in_R9;
  message_flags in_stack_ffffffffffffffcc;
  prepared_buffers<asio::const_buffer,_64UL> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>::
  reactive_socket_send_op_base
            ((reactive_socket_send_op_base<asio::detail::prepared_buffers<asio::const_buffer,_64UL>_>
              *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(socket_type)((ulong)in_R9 >> 0x20),
             (state_type)((ulong)in_R9 >> 0x18),in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             in_RDI);
  write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::write_op((write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
              *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9);
  handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>,_asio::system_executor>
  ::start((write_op<asio::basic_stream_socket<asio::ip::tcp>,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
           *)(in_RDI + 0x150));
  return;
}

Assistant:

reactive_socket_send_op(socket_type socket,
      socket_ops::state_type state, const ConstBufferSequence& buffers,
      socket_base::message_flags flags, Handler& handler)
    : reactive_socket_send_op_base<ConstBufferSequence>(socket,
        state, buffers, flags, &reactive_socket_send_op::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(handler))
  {
    handler_work<Handler>::start(handler_);
  }